

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O2

int Abc_SclIsInv(Abc_Obj_t *pObj)

{
  word wVar1;
  
  if ((*(uint *)&pObj->field_0x14 & 0xf) == 7) {
    wVar1 = Mio_GateReadTruth((Mio_Gate_t *)(pObj->field_5).pData);
    return (int)(wVar1 == 0x5555555555555555);
  }
  __assert_fail("Abc_ObjIsNode(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclBuffer.c"
                ,0x76,"int Abc_SclIsInv(Abc_Obj_t *)");
}

Assistant:

int Abc_SclIsInv( Abc_Obj_t * pObj )
{
    assert( Abc_ObjIsNode(pObj) );
    return Mio_GateReadTruth((Mio_Gate_t *)pObj->pData) == ABC_CONST(0x5555555555555555);
}